

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

int al_ustr_offset(ALLEGRO_USTR *us,int index)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uchar *puVar7;
  
  if (index < 0) {
    sVar2 = al_ustr_length(us);
    index = (int)sVar2 + index;
  }
  uVar3 = 0;
  do {
    iVar5 = (int)uVar3;
    if (index < 1) {
      return iVar5;
    }
    if (us == (ALLEGRO_USTR *)0x0) {
      puVar7 = (uchar *)0x0;
      uVar6 = 0;
    }
    else {
      puVar7 = us->data;
      uVar6 = (ulong)(uint)us->slen;
      if (us->slen < 1) {
        uVar6 = 0;
      }
    }
    uVar4 = uVar3;
    if (iVar5 < (int)uVar6) {
      uVar3 = (long)iVar5;
      while (uVar4 = uVar6, uVar6 - 1 != uVar3) {
        lVar1 = uVar3 + 1;
        uVar4 = uVar3 + 1;
        if ((-1 < (char)puVar7[lVar1]) || (uVar3 = uVar4, puVar7[lVar1] - 0xc0 < 0x3e)) break;
      }
    }
    index = index + -1;
    uVar3 = uVar4 & 0xffffffff;
    if ((int)uVar6 <= iVar5) {
      return (int)uVar4;
    }
  } while( true );
}

Assistant:

int al_ustr_offset(const ALLEGRO_USTR *us, int index)
{
   int pos = 0;

   if (index < 0)
      index += al_ustr_length(us);

   while (index-- > 0) {
      if (!al_ustr_next(us, &pos))
         return pos;
   }

   return pos;
}